

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vector.cpp
# Opt level: O1

Vector * __thiscall
KDIS::DATA_TYPE::Vector::operator*(Vector *__return_storage_ptr__,Vector *this,KFLOAT64 Value)

{
  KFLOAT32 KVar1;
  Vector *tmp;
  
  (__return_storage_ptr__->super_DataTypeBase)._vptr_DataTypeBase =
       (_func_int **)&PTR__DataTypeBase_002241d0;
  KVar1 = this->m_f32Y;
  __return_storage_ptr__->m_f32X = this->m_f32X;
  __return_storage_ptr__->m_f32Y = KVar1;
  __return_storage_ptr__->m_f32Z = this->m_f32Z;
  __return_storage_ptr__->m_f32X =
       (KFLOAT32)(float)((double)(float)__return_storage_ptr__->m_f32X * (double)Value);
  __return_storage_ptr__->m_f32Y =
       (KFLOAT32)(float)((double)(float)__return_storage_ptr__->m_f32Y * (double)Value);
  __return_storage_ptr__->m_f32Z =
       (KFLOAT32)(float)((double)(float)__return_storage_ptr__->m_f32Z * (double)Value);
  return __return_storage_ptr__;
}

Assistant:

Vector Vector::operator * ( KFLOAT64 Value ) const
{
    Vector tmp = *this;
    tmp.m_f32X *= Value;
    tmp.m_f32Y *= Value;
    tmp.m_f32Z *= Value;
    return tmp;
}